

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<kj::Own<kj::AsyncIoStream>_> __thiscall
kj::Promise<kj::Own<kj::AsyncIoStream>>::attach<kj::Own<kj::NetworkAddress>>
          (Promise<kj::Own<kj::AsyncIoStream>> *this,Own<kj::NetworkAddress> *attachments)

{
  Own<kj::_::PromiseNode> *params;
  Own<kj::NetworkAddress> *params_00;
  NoInfer<kj::Own<kj::NetworkAddress>_> *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<kj::Own<kj::AsyncIoStream>_> PVar1;
  Own<kj::NetworkAddress> local_50;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_>_> local_40;
  Own<kj::_::PromiseNode> local_30;
  NoInfer<kj::Own<kj::NetworkAddress>_> *local_20;
  Own<kj::NetworkAddress> *attachments_local;
  Promise<kj::Own<kj::AsyncIoStream>_> *this_local;
  
  local_20 = in_RDX;
  attachments_local = attachments;
  this_local = (Promise<kj::Own<kj::AsyncIoStream>_> *)this;
  params = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)attachments);
  params_00 = fwd<kj::Own<kj::NetworkAddress>>(local_20);
  tuple<kj::Own<kj::NetworkAddress>>((kj *)&local_50,params_00);
  heap<kj::_::AttachmentPromiseNode<kj::Own<kj::NetworkAddress>>,kj::Own<kj::_::PromiseNode>,kj::Own<kj::NetworkAddress>>
            ((kj *)&local_40,params,&local_50);
  Own<kj::_::PromiseNode>::Own<kj::_::AttachmentPromiseNode<kj::Own<kj::NetworkAddress>>,void>
            (&local_30,&local_40);
  Promise<kj::Own<kj::AsyncIoStream>_>::Promise
            ((Promise<kj::Own<kj::AsyncIoStream>_> *)this,false,&local_30);
  Own<kj::_::PromiseNode>::~Own(&local_30);
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_>_>::~Own(&local_40);
  Own<kj::NetworkAddress>::~Own(&local_50);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Own<kj::AsyncIoStream>_>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}